

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O0

void __thiscall
llvm::DWARFListTableHeader::dump(DWARFListTableHeader *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  unsigned_long uVar1;
  uint64_t uVar2;
  raw_ostream *prVar3;
  bool bVar4;
  byte bVar5;
  uint *in_stack_ffffffffffffff08;
  unsigned_long local_b8;
  format_object<unsigned_long> local_b0;
  format_object<unsigned_long> local_98;
  reference local_80;
  unsigned_long *Off;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  format_object<const_char_*,_unsigned_long,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_int>
  local_58;
  format_object<unsigned_long> local_30;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  DWARFListTableHeader *this_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  if (((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    format<unsigned_long>(&local_30,"0x%8.8lx: ",&this->HeaderOffset);
    raw_ostream::operator<<(OS,&local_30.super_format_object_base);
  }
  prVar3 = local_18;
  __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             StringRef::data(&this->ListTypeString);
  format<char_const*,unsigned_long,unsigned_short,unsigned_char,unsigned_char,unsigned_int>
            (&local_58,
             (llvm *)
             "%s list header: length = 0x%8.8lx, version = 0x%4.4x, addr_size = 0x%2.2x, seg_size = 0x%2.2x, offset_entry_count = 0x%8.8x\n"
             ,(char *)&__range2,(char **)this,(unsigned_long *)&(this->HeaderData).Version,
             (unsigned_short *)&(this->HeaderData).AddrSize,&(this->HeaderData).SegSize,
             (uchar *)&(this->HeaderData).OffsetEntryCount,in_stack_ffffffffffffff08);
  raw_ostream::operator<<(prVar3,&local_58.super_format_object_base);
  if ((this->HeaderData).OffsetEntryCount != 0) {
    raw_ostream::operator<<(local_18,"offsets: [");
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->Offsets);
    Off = (unsigned_long *)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->Offsets);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&Off);
      if (!bVar4) break;
      local_80 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
      prVar3 = local_18;
      format<unsigned_long>(&local_98,"\n0x%8.8lx",local_80);
      raw_ostream::operator<<(prVar3,&local_98.super_format_object_base);
      prVar3 = local_18;
      if (((undefined1  [24])DumpOpts & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
        uVar1 = *local_80;
        uVar2 = this->HeaderOffset;
        bVar5 = getHeaderSize(this->Format);
        local_b8 = uVar1 + uVar2 + (ulong)bVar5;
        format<unsigned_long>(&local_b0," => 0x%8.8lx",&local_b8);
        raw_ostream::operator<<(prVar3,&local_b0.super_format_object_base);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    raw_ostream::operator<<(local_18,"\n]\n");
  }
  return;
}

Assistant:

void DWARFListTableHeader::dump(raw_ostream &OS, DIDumpOptions DumpOpts) const {
  if (DumpOpts.Verbose)
    OS << format("0x%8.8" PRIx64 ": ", HeaderOffset);
  OS << format(
      "%s list header: length = 0x%8.8" PRIx64 ", version = 0x%4.4" PRIx16 ", "
      "addr_size = 0x%2.2" PRIx8 ", seg_size = 0x%2.2" PRIx8
      ", offset_entry_count = "
      "0x%8.8" PRIx32 "\n",
      ListTypeString.data(), HeaderData.Length, HeaderData.Version,
      HeaderData.AddrSize, HeaderData.SegSize, HeaderData.OffsetEntryCount);

  if (HeaderData.OffsetEntryCount > 0) {
    OS << "offsets: [";
    for (const auto &Off : Offsets) {
      OS << format("\n0x%8.8" PRIx64, Off);
      if (DumpOpts.Verbose)
        OS << format(" => 0x%8.8" PRIx64,
                     Off + HeaderOffset + getHeaderSize(Format));
    }
    OS << "\n]\n";
  }
}